

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::NumWorkGroupsCase::NumWorkGroupsCase
          (NumWorkGroupsCase *this,Context *context)

{
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  *this_00;
  undefined1 local_30 [8];
  undefined8 uStack_28;
  undefined1 *local_20;
  
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (&this->super_ComputeBuiltinVarCase,context,"num_work_groups","gl_NumWorkGroups",
             TYPE_UINT_VEC3);
  (this->super_ComputeBuiltinVarCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_021b9018;
  local_30 = (undefined1  [8])&DAT_100000001;
  uStack_28 = &DAT_100000001;
  local_20 = &DAT_100000001;
  this_00 = &(this->super_ComputeBuiltinVarCase).m_subCases;
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>
            (this_00,(SubCase *)local_30);
  local_30 = (undefined1  [8])&DAT_100000001;
  uStack_28._0_4_ = 1;
  uStack_28._4_4_ = 0x34;
  local_20 = &DAT_100000001;
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>
            (this_00,(SubCase *)local_30);
  local_30 = (undefined1  [8])&DAT_100000001;
  uStack_28 = &DAT_100000001;
  local_20 = (undefined1 *)0x100000027;
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>
            (this_00,(SubCase *)local_30);
  local_30 = (undefined1  [8])&DAT_100000001;
  uStack_28 = &DAT_100000001;
  local_20 = (undefined1 *)0x4e00000001;
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>
            (this_00,(SubCase *)local_30);
  local_30 = (undefined1  [8])&DAT_100000001;
  uStack_28._0_4_ = 1;
  uStack_28._4_4_ = 4;
  local_20 = (undefined1 *)0xb00000007;
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>
            (this_00,(SubCase *)local_30);
  local_30._0_4_ = 2;
  local_30._4_4_ = 3;
  uStack_28._0_4_ = 4;
  uStack_28._4_4_ = 4;
  local_20 = (undefined1 *)0xb00000007;
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::emplace_back<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>
            (this_00,(SubCase *)local_30);
  return;
}

Assistant:

NumWorkGroupsCase (Context& context)
		: ComputeBuiltinVarCase(context, "num_work_groups", "gl_NumWorkGroups", TYPE_UINT_VEC3)
	{
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(1,1,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(52,1,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(1,39,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(1,1,78)));
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(4,7,11)));
		m_subCases.push_back(SubCase(UVec3(2,3,4), UVec3(4,7,11)));
	}